

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Patterns.h
# Opt level: O0

void __thiscall
slang::ast::StructurePattern::visitExprs<slang::ast::builtins::SequenceMethodExprVisitor&>
          (StructurePattern *this,SequenceMethodExprVisitor *visitor)

{
  bool bVar1;
  iterator this_00;
  iterator visitor_00;
  FieldPattern *pattern;
  iterator __end3;
  iterator __begin3;
  span<const_slang::ast::StructurePattern::FieldPattern,_18446744073709551615UL> *__range3;
  span<const_slang::ast::StructurePattern::FieldPattern,_18446744073709551615UL>
  *in_stack_ffffffffffffffc8;
  reference in_stack_ffffffffffffffd0;
  span<const_slang::ast::StructurePattern::FieldPattern,_18446744073709551615UL>
  *in_stack_ffffffffffffffd8;
  
  this_00 = std::span<const_slang::ast::StructurePattern::FieldPattern,_18446744073709551615UL>::
            begin(in_stack_ffffffffffffffc8);
  visitor_00 = std::span<const_slang::ast::StructurePattern::FieldPattern,_18446744073709551615UL>::
               end(in_stack_ffffffffffffffd8);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::StructurePattern::FieldPattern_*,_std::span<const_slang::ast::StructurePattern::FieldPattern,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::StructurePattern::FieldPattern_*,_std::span<const_slang::ast::StructurePattern::FieldPattern,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffffd0,
                       (__normal_iterator<const_slang::ast::StructurePattern::FieldPattern_*,_std::span<const_slang::ast::StructurePattern::FieldPattern,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffffc8);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    in_stack_ffffffffffffffd0 =
         __gnu_cxx::
         __normal_iterator<const_slang::ast::StructurePattern::FieldPattern_*,_std::span<const_slang::ast::StructurePattern::FieldPattern,_18446744073709551615UL>_>
         ::operator*((__normal_iterator<const_slang::ast::StructurePattern::FieldPattern_*,_std::span<const_slang::ast::StructurePattern::FieldPattern,_18446744073709551615UL>_>
                      *)&stack0xffffffffffffffe0);
    not_null<const_slang::ast::Pattern_*>::operator->
              ((not_null<const_slang::ast::Pattern_*> *)0x96659e);
    Pattern::visit<slang::ast::builtins::SequenceMethodExprVisitor>
              ((Pattern *)this_00._M_current,(SequenceMethodExprVisitor *)visitor_00._M_current);
    __gnu_cxx::
    __normal_iterator<const_slang::ast::StructurePattern::FieldPattern_*,_std::span<const_slang::ast::StructurePattern::FieldPattern,_18446744073709551615UL>_>
    ::operator++((__normal_iterator<const_slang::ast::StructurePattern::FieldPattern_*,_std::span<const_slang::ast::StructurePattern::FieldPattern,_18446744073709551615UL>_>
                  *)&stack0xffffffffffffffe0);
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        for (auto& pattern : patterns)
            pattern.pattern->visit(visitor);
    }